

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StandardShapes.cpp
# Opt level: O1

uint Assimp::StandardShapes::MakeIcosahedron
               (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *positions)

{
  pointer *ppaVar1;
  iterator iVar2;
  aiVector3t<float> local_d0;
  aiVector3t<float> local_c0;
  aiVector3t<float> local_b0;
  aiVector3t<float> local_a0;
  aiVector3t<float> local_90;
  aiVector3t<float> local_80;
  aiVector3t<float> local_70;
  aiVector3t<float> local_60;
  aiVector3t<float> local_50;
  aiVector3t<float> local_40;
  aiVector3t<float> local_30;
  aiVector3t<float> local_20;
  
  ppaVar1 = &(positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)
             ._M_impl.super__Vector_impl_data._M_finish;
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve
            (positions,
             ((long)(positions->
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(positions->
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                    _M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555 + 0x3c);
  local_20.x = 0.8506508;
  local_20.y = 0.5257311;
  local_20.z = 0.0;
  local_30.x = -0.8506508;
  local_30.y = 0.5257311;
  local_30.z = 0.0;
  local_40.x = 0.8506508;
  local_40.y = -0.5257311;
  local_40.z = 0.0;
  local_50.x = -0.8506508;
  local_50.y = -0.5257311;
  local_50.z = 0.0;
  local_60.x = 0.5257311;
  local_60.y = 0.0;
  local_60.z = 0.8506508;
  local_70.x = 0.5257311;
  local_70.y = 0.0;
  local_70.z = -0.8506508;
  local_80.x = -0.5257311;
  local_80.y = 0.0;
  local_80.z = 0.8506508;
  local_90.x = -0.5257311;
  local_90.y = 0.0;
  local_90.z = -0.8506508;
  local_a0.x = 0.0;
  local_a0.y = 0.8506508;
  local_a0.z = 0.5257311;
  local_b0.x = 0.0;
  local_b0.y = -0.8506508;
  local_b0.z = 0.5257311;
  local_c0.x = 0.0;
  local_c0.y = 0.8506508;
  local_c0.z = -0.5257311;
  local_d0.x = 0.0;
  local_d0.y = -0.8506508;
  local_d0.z = -0.5257311;
  iVar2._M_current =
       (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>const&>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar2,
               &local_20);
  }
  else {
    (iVar2._M_current)->z = 0.0;
    (iVar2._M_current)->x = 0.8506508;
    (iVar2._M_current)->y = 0.5257311;
    *ppaVar1 = *ppaVar1 + 1;
  }
  iVar2._M_current =
       (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>const&>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar2,
               &local_a0);
  }
  else {
    (iVar2._M_current)->z = local_a0.z;
    (iVar2._M_current)->x = local_a0.x;
    (iVar2._M_current)->y = local_a0.y;
    *ppaVar1 = *ppaVar1 + 1;
  }
  iVar2._M_current =
       (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>const&>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar2,
               &local_60);
  }
  else {
    (iVar2._M_current)->z = local_60.z;
    (iVar2._M_current)->x = local_60.x;
    (iVar2._M_current)->y = local_60.y;
    *ppaVar1 = *ppaVar1 + 1;
  }
  iVar2._M_current =
       (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>const&>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar2,
               &local_20);
  }
  else {
    (iVar2._M_current)->z = local_20.z;
    (iVar2._M_current)->x = local_20.x;
    (iVar2._M_current)->y = local_20.y;
    *ppaVar1 = *ppaVar1 + 1;
  }
  iVar2._M_current =
       (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>const&>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar2,
               &local_70);
  }
  else {
    (iVar2._M_current)->z = local_70.z;
    (iVar2._M_current)->x = local_70.x;
    (iVar2._M_current)->y = local_70.y;
    *ppaVar1 = *ppaVar1 + 1;
  }
  iVar2._M_current =
       (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>const&>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar2,
               &local_c0);
  }
  else {
    (iVar2._M_current)->z = local_c0.z;
    (iVar2._M_current)->x = local_c0.x;
    (iVar2._M_current)->y = local_c0.y;
    *ppaVar1 = *ppaVar1 + 1;
  }
  iVar2._M_current =
       (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>const&>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar2,
               &local_40);
  }
  else {
    (iVar2._M_current)->z = local_40.z;
    (iVar2._M_current)->x = local_40.x;
    (iVar2._M_current)->y = local_40.y;
    *ppaVar1 = *ppaVar1 + 1;
  }
  iVar2._M_current =
       (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>const&>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar2,
               &local_60);
  }
  else {
    (iVar2._M_current)->z = local_60.z;
    (iVar2._M_current)->x = local_60.x;
    (iVar2._M_current)->y = local_60.y;
    *ppaVar1 = *ppaVar1 + 1;
  }
  iVar2._M_current =
       (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>const&>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar2,
               &local_b0);
  }
  else {
    (iVar2._M_current)->z = local_b0.z;
    (iVar2._M_current)->x = local_b0.x;
    (iVar2._M_current)->y = local_b0.y;
    *ppaVar1 = *ppaVar1 + 1;
  }
  iVar2._M_current =
       (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>const&>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar2,
               &local_40);
  }
  else {
    (iVar2._M_current)->z = local_40.z;
    (iVar2._M_current)->x = local_40.x;
    (iVar2._M_current)->y = local_40.y;
    *ppaVar1 = *ppaVar1 + 1;
  }
  iVar2._M_current =
       (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>const&>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar2,
               &local_d0);
  }
  else {
    (iVar2._M_current)->z = local_d0.z;
    (iVar2._M_current)->x = local_d0.x;
    (iVar2._M_current)->y = local_d0.y;
    *ppaVar1 = *ppaVar1 + 1;
  }
  iVar2._M_current =
       (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>const&>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar2,
               &local_70);
  }
  else {
    (iVar2._M_current)->z = local_70.z;
    (iVar2._M_current)->x = local_70.x;
    (iVar2._M_current)->y = local_70.y;
    *ppaVar1 = *ppaVar1 + 1;
  }
  iVar2._M_current =
       (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>const&>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar2,
               &local_30);
  }
  else {
    (iVar2._M_current)->z = local_30.z;
    (iVar2._M_current)->x = local_30.x;
    (iVar2._M_current)->y = local_30.y;
    *ppaVar1 = *ppaVar1 + 1;
  }
  iVar2._M_current =
       (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>const&>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar2,
               &local_80);
  }
  else {
    (iVar2._M_current)->z = local_80.z;
    (iVar2._M_current)->x = local_80.x;
    (iVar2._M_current)->y = local_80.y;
    *ppaVar1 = *ppaVar1 + 1;
  }
  iVar2._M_current =
       (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>const&>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar2,
               &local_a0);
  }
  else {
    (iVar2._M_current)->z = local_a0.z;
    (iVar2._M_current)->x = local_a0.x;
    (iVar2._M_current)->y = local_a0.y;
    *ppaVar1 = *ppaVar1 + 1;
  }
  iVar2._M_current =
       (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>const&>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar2,
               &local_30);
  }
  else {
    (iVar2._M_current)->z = local_30.z;
    (iVar2._M_current)->x = local_30.x;
    (iVar2._M_current)->y = local_30.y;
    *ppaVar1 = *ppaVar1 + 1;
  }
  iVar2._M_current =
       (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>const&>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar2,
               &local_c0);
  }
  else {
    (iVar2._M_current)->z = local_c0.z;
    (iVar2._M_current)->x = local_c0.x;
    (iVar2._M_current)->y = local_c0.y;
    *ppaVar1 = *ppaVar1 + 1;
  }
  iVar2._M_current =
       (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>const&>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar2,
               &local_90);
  }
  else {
    (iVar2._M_current)->z = local_90.z;
    (iVar2._M_current)->x = local_90.x;
    (iVar2._M_current)->y = local_90.y;
    *ppaVar1 = *ppaVar1 + 1;
  }
  iVar2._M_current =
       (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>const&>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar2,
               &local_50);
  }
  else {
    (iVar2._M_current)->z = local_50.z;
    (iVar2._M_current)->x = local_50.x;
    (iVar2._M_current)->y = local_50.y;
    *ppaVar1 = *ppaVar1 + 1;
  }
  iVar2._M_current =
       (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>const&>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar2,
               &local_b0);
  }
  else {
    (iVar2._M_current)->z = local_b0.z;
    (iVar2._M_current)->x = local_b0.x;
    (iVar2._M_current)->y = local_b0.y;
    *ppaVar1 = *ppaVar1 + 1;
  }
  iVar2._M_current =
       (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>const&>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar2,
               &local_80);
  }
  else {
    (iVar2._M_current)->z = local_80.z;
    (iVar2._M_current)->x = local_80.x;
    (iVar2._M_current)->y = local_80.y;
    *ppaVar1 = *ppaVar1 + 1;
  }
  iVar2._M_current =
       (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>const&>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar2,
               &local_50);
  }
  else {
    (iVar2._M_current)->z = local_50.z;
    (iVar2._M_current)->x = local_50.x;
    (iVar2._M_current)->y = local_50.y;
    *ppaVar1 = *ppaVar1 + 1;
  }
  iVar2._M_current =
       (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>const&>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar2,
               &local_90);
  }
  else {
    (iVar2._M_current)->z = local_90.z;
    (iVar2._M_current)->x = local_90.x;
    (iVar2._M_current)->y = local_90.y;
    *ppaVar1 = *ppaVar1 + 1;
  }
  iVar2._M_current =
       (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>const&>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar2,
               &local_d0);
  }
  else {
    (iVar2._M_current)->z = local_d0.z;
    (iVar2._M_current)->x = local_d0.x;
    (iVar2._M_current)->y = local_d0.y;
    *ppaVar1 = *ppaVar1 + 1;
  }
  iVar2._M_current =
       (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>const&>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar2,
               &local_20);
  }
  else {
    (iVar2._M_current)->z = local_20.z;
    (iVar2._M_current)->x = local_20.x;
    (iVar2._M_current)->y = local_20.y;
    *ppaVar1 = *ppaVar1 + 1;
  }
  iVar2._M_current =
       (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>const&>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar2,
               &local_c0);
  }
  else {
    (iVar2._M_current)->z = local_c0.z;
    (iVar2._M_current)->x = local_c0.x;
    (iVar2._M_current)->y = local_c0.y;
    *ppaVar1 = *ppaVar1 + 1;
  }
  iVar2._M_current =
       (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>const&>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar2,
               &local_a0);
  }
  else {
    (iVar2._M_current)->z = local_a0.z;
    (iVar2._M_current)->x = local_a0.x;
    (iVar2._M_current)->y = local_a0.y;
    *ppaVar1 = *ppaVar1 + 1;
  }
  iVar2._M_current =
       (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>const&>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar2,
               &local_30);
  }
  else {
    (iVar2._M_current)->z = local_30.z;
    (iVar2._M_current)->x = local_30.x;
    (iVar2._M_current)->y = local_30.y;
    *ppaVar1 = *ppaVar1 + 1;
  }
  iVar2._M_current =
       (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>const&>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar2,
               &local_a0);
  }
  else {
    (iVar2._M_current)->z = local_a0.z;
    (iVar2._M_current)->x = local_a0.x;
    (iVar2._M_current)->y = local_a0.y;
    *ppaVar1 = *ppaVar1 + 1;
  }
  iVar2._M_current =
       (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>const&>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar2,
               &local_c0);
  }
  else {
    (iVar2._M_current)->z = local_c0.z;
    (iVar2._M_current)->x = local_c0.x;
    (iVar2._M_current)->y = local_c0.y;
    *ppaVar1 = *ppaVar1 + 1;
  }
  iVar2._M_current =
       (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>const&>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar2,
               &local_40);
  }
  else {
    (iVar2._M_current)->z = local_40.z;
    (iVar2._M_current)->x = local_40.x;
    (iVar2._M_current)->y = local_40.y;
    *ppaVar1 = *ppaVar1 + 1;
  }
  iVar2._M_current =
       (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>const&>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar2,
               &local_b0);
  }
  else {
    (iVar2._M_current)->z = local_b0.z;
    (iVar2._M_current)->x = local_b0.x;
    (iVar2._M_current)->y = local_b0.y;
    *ppaVar1 = *ppaVar1 + 1;
  }
  iVar2._M_current =
       (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>const&>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar2,
               &local_d0);
  }
  else {
    (iVar2._M_current)->z = local_d0.z;
    (iVar2._M_current)->x = local_d0.x;
    (iVar2._M_current)->y = local_d0.y;
    *ppaVar1 = *ppaVar1 + 1;
  }
  iVar2._M_current =
       (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>const&>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar2,
               &local_50);
  }
  else {
    (iVar2._M_current)->z = local_50.z;
    (iVar2._M_current)->x = local_50.x;
    (iVar2._M_current)->y = local_50.y;
    *ppaVar1 = *ppaVar1 + 1;
  }
  iVar2._M_current =
       (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>const&>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar2,
               &local_d0);
  }
  else {
    (iVar2._M_current)->z = local_d0.z;
    (iVar2._M_current)->x = local_d0.x;
    (iVar2._M_current)->y = local_d0.y;
    *ppaVar1 = *ppaVar1 + 1;
  }
  iVar2._M_current =
       (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>const&>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar2,
               &local_b0);
  }
  else {
    (iVar2._M_current)->z = local_b0.z;
    (iVar2._M_current)->x = local_b0.x;
    (iVar2._M_current)->y = local_b0.y;
    *ppaVar1 = *ppaVar1 + 1;
  }
  iVar2._M_current =
       (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>const&>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar2,
               &local_60);
  }
  else {
    (iVar2._M_current)->z = local_60.z;
    (iVar2._M_current)->x = local_60.x;
    (iVar2._M_current)->y = local_60.y;
    *ppaVar1 = *ppaVar1 + 1;
  }
  iVar2._M_current =
       (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>const&>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar2,
               &local_40);
  }
  else {
    (iVar2._M_current)->z = local_40.z;
    (iVar2._M_current)->x = local_40.x;
    (iVar2._M_current)->y = local_40.y;
    *ppaVar1 = *ppaVar1 + 1;
  }
  iVar2._M_current =
       (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>const&>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar2,
               &local_20);
  }
  else {
    (iVar2._M_current)->z = local_20.z;
    (iVar2._M_current)->x = local_20.x;
    (iVar2._M_current)->y = local_20.y;
    *ppaVar1 = *ppaVar1 + 1;
  }
  iVar2._M_current =
       (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>const&>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar2,
               &local_70);
  }
  else {
    (iVar2._M_current)->z = local_70.z;
    (iVar2._M_current)->x = local_70.x;
    (iVar2._M_current)->y = local_70.y;
    *ppaVar1 = *ppaVar1 + 1;
  }
  iVar2._M_current =
       (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>const&>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar2,
               &local_20);
  }
  else {
    (iVar2._M_current)->z = local_20.z;
    (iVar2._M_current)->x = local_20.x;
    (iVar2._M_current)->y = local_20.y;
    *ppaVar1 = *ppaVar1 + 1;
  }
  iVar2._M_current =
       (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>const&>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar2,
               &local_40);
  }
  else {
    (iVar2._M_current)->z = local_40.z;
    (iVar2._M_current)->x = local_40.x;
    (iVar2._M_current)->y = local_40.y;
    *ppaVar1 = *ppaVar1 + 1;
  }
  iVar2._M_current =
       (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>const&>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar2,
               &local_80);
  }
  else {
    (iVar2._M_current)->z = local_80.z;
    (iVar2._M_current)->x = local_80.x;
    (iVar2._M_current)->y = local_80.y;
    *ppaVar1 = *ppaVar1 + 1;
  }
  iVar2._M_current =
       (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>const&>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar2,
               &local_30);
  }
  else {
    (iVar2._M_current)->z = local_30.z;
    (iVar2._M_current)->x = local_30.x;
    (iVar2._M_current)->y = local_30.y;
    *ppaVar1 = *ppaVar1 + 1;
  }
  iVar2._M_current =
       (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>const&>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar2,
               &local_50);
  }
  else {
    (iVar2._M_current)->z = local_50.z;
    (iVar2._M_current)->x = local_50.x;
    (iVar2._M_current)->y = local_50.y;
    *ppaVar1 = *ppaVar1 + 1;
  }
  iVar2._M_current =
       (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>const&>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar2,
               &local_90);
  }
  else {
    (iVar2._M_current)->z = local_90.z;
    (iVar2._M_current)->x = local_90.x;
    (iVar2._M_current)->y = local_90.y;
    *ppaVar1 = *ppaVar1 + 1;
  }
  iVar2._M_current =
       (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>const&>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar2,
               &local_50);
  }
  else {
    (iVar2._M_current)->z = local_50.z;
    (iVar2._M_current)->x = local_50.x;
    (iVar2._M_current)->y = local_50.y;
    *ppaVar1 = *ppaVar1 + 1;
  }
  iVar2._M_current =
       (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>const&>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar2,
               &local_30);
  }
  else {
    (iVar2._M_current)->z = local_30.z;
    (iVar2._M_current)->x = local_30.x;
    (iVar2._M_current)->y = local_30.y;
    *ppaVar1 = *ppaVar1 + 1;
  }
  iVar2._M_current =
       (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>const&>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar2,
               &local_a0);
  }
  else {
    (iVar2._M_current)->z = local_a0.z;
    (iVar2._M_current)->x = local_a0.x;
    (iVar2._M_current)->y = local_a0.y;
    *ppaVar1 = *ppaVar1 + 1;
  }
  iVar2._M_current =
       (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>const&>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar2,
               &local_80);
  }
  else {
    (iVar2._M_current)->z = local_80.z;
    (iVar2._M_current)->x = local_80.x;
    (iVar2._M_current)->y = local_80.y;
    *ppaVar1 = *ppaVar1 + 1;
  }
  iVar2._M_current =
       (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>const&>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar2,
               &local_60);
  }
  else {
    (iVar2._M_current)->z = local_60.z;
    (iVar2._M_current)->x = local_60.x;
    (iVar2._M_current)->y = local_60.y;
    *ppaVar1 = *ppaVar1 + 1;
  }
  iVar2._M_current =
       (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>const&>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar2,
               &local_b0);
  }
  else {
    (iVar2._M_current)->z = local_b0.z;
    (iVar2._M_current)->x = local_b0.x;
    (iVar2._M_current)->y = local_b0.y;
    *ppaVar1 = *ppaVar1 + 1;
  }
  iVar2._M_current =
       (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>const&>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar2,
               &local_60);
  }
  else {
    (iVar2._M_current)->z = local_60.z;
    (iVar2._M_current)->x = local_60.x;
    (iVar2._M_current)->y = local_60.y;
    *ppaVar1 = *ppaVar1 + 1;
  }
  iVar2._M_current =
       (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>const&>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar2,
               &local_80);
  }
  else {
    (iVar2._M_current)->z = local_80.z;
    (iVar2._M_current)->x = local_80.x;
    (iVar2._M_current)->y = local_80.y;
    *ppaVar1 = *ppaVar1 + 1;
  }
  iVar2._M_current =
       (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>const&>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar2,
               &local_c0);
  }
  else {
    (iVar2._M_current)->z = local_c0.z;
    (iVar2._M_current)->x = local_c0.x;
    (iVar2._M_current)->y = local_c0.y;
    *ppaVar1 = *ppaVar1 + 1;
  }
  iVar2._M_current =
       (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>const&>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar2,
               &local_70);
  }
  else {
    (iVar2._M_current)->z = local_70.z;
    (iVar2._M_current)->x = local_70.x;
    (iVar2._M_current)->y = local_70.y;
    *ppaVar1 = *ppaVar1 + 1;
  }
  iVar2._M_current =
       (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>const&>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar2,
               &local_90);
  }
  else {
    (iVar2._M_current)->z = local_90.z;
    (iVar2._M_current)->x = local_90.x;
    (iVar2._M_current)->y = local_90.y;
    *ppaVar1 = *ppaVar1 + 1;
  }
  iVar2._M_current =
       (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>const&>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar2,
               &local_d0);
  }
  else {
    (iVar2._M_current)->z = local_d0.z;
    (iVar2._M_current)->x = local_d0.x;
    (iVar2._M_current)->y = local_d0.y;
    *ppaVar1 = *ppaVar1 + 1;
  }
  iVar2._M_current =
       (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>const&>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar2,
               &local_90);
  }
  else {
    (iVar2._M_current)->z = local_90.z;
    (iVar2._M_current)->x = local_90.x;
    (iVar2._M_current)->y = local_90.y;
    *ppaVar1 = *ppaVar1 + 1;
  }
  iVar2._M_current =
       (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (positions->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>const&>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)positions,iVar2,
               &local_70);
  }
  else {
    (iVar2._M_current)->z = local_70.z;
    (iVar2._M_current)->x = local_70.x;
    (iVar2._M_current)->y = local_70.y;
    *ppaVar1 = *ppaVar1 + 1;
  }
  return 3;
}

Assistant:

unsigned int StandardShapes::MakeIcosahedron(std::vector<aiVector3D>& positions)
{
    positions.reserve(positions.size()+60);

    const ai_real t = ( ai_real( 1.0 )+ ai_real( 2.236067977 ) ) / ai_real( 2.0 );
    const ai_real s = std::sqrt(ai_real(1.0) + t*t);

    const aiVector3D v0  = aiVector3D(t,1.0, 0.0)/s;
    const aiVector3D v1  = aiVector3D(-t,1.0, 0.0)/s;
    const aiVector3D v2  = aiVector3D(t,-1.0, 0.0)/s;
    const aiVector3D v3  = aiVector3D(-t,-1.0, 0.0)/s;
    const aiVector3D v4  = aiVector3D(1.0, 0.0, t)/s;
    const aiVector3D v5  = aiVector3D(1.0, 0.0,-t)/s;
    const aiVector3D v6  = aiVector3D(-1.0, 0.0,t)/s;
    const aiVector3D v7  = aiVector3D(-1.0, 0.0,-t)/s;
    const aiVector3D v8  = aiVector3D(0.0, t, 1.0)/s;
    const aiVector3D v9  = aiVector3D(0.0,-t, 1.0)/s;
    const aiVector3D v10 = aiVector3D(0.0, t,-1.0)/s;
    const aiVector3D v11 = aiVector3D(0.0,-t,-1.0)/s;

    ADD_TRIANGLE(v0,v8,v4);
    ADD_TRIANGLE(v0,v5,v10);
    ADD_TRIANGLE(v2,v4,v9);
    ADD_TRIANGLE(v2,v11,v5);

    ADD_TRIANGLE(v1,v6,v8);
    ADD_TRIANGLE(v1,v10,v7);
    ADD_TRIANGLE(v3,v9,v6);
    ADD_TRIANGLE(v3,v7,v11);

    ADD_TRIANGLE(v0,v10,v8);
    ADD_TRIANGLE(v1,v8,v10);
    ADD_TRIANGLE(v2,v9,v11);
    ADD_TRIANGLE(v3,v11,v9);

    ADD_TRIANGLE(v4,v2,v0);
    ADD_TRIANGLE(v5,v0,v2);
    ADD_TRIANGLE(v6,v1,v3);
    ADD_TRIANGLE(v7,v3,v1);

    ADD_TRIANGLE(v8,v6,v4);
    ADD_TRIANGLE(v9,v4,v6);
    ADD_TRIANGLE(v10,v5,v7);
    ADD_TRIANGLE(v11,v7,v5);
    return 3;
}